

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_redaction.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto2_unittest::TestMessageEnum::_InternalSerialize
          (TestMessageEnum *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong uVar1;
  int iVar2;
  uint8_t *puVar3;
  const_reference piVar4;
  int index;
  
  iVar2 = google::protobuf::RepeatedField<int>::size(&(this->field_0)._impl_.redactable_enum_);
  index = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  for (; iVar2 != index; index = index + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    piVar4 = google::protobuf::RepeatedField<int>::Get
                       (&(this->field_0)._impl_.redactable_enum_,index);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray(1,*piVar4,puVar3);
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar3;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestMessageEnum::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestMessageEnum& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestMessageEnum)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated .proto2_unittest.MetaAnnotatedEnum redactable_enum = 1;
  for (int i = 0, n = this_._internal_redactable_enum_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1, static_cast<::proto2_unittest::MetaAnnotatedEnum>(this_._internal_redactable_enum().Get(i)),
        target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestMessageEnum)
  return target;
}